

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void __thiscall
SVGChart::PlotDataContainer::AddXYPlot
          (PlotDataContainer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          LegendData *inLegendData,DataDrawerBase *inDataDrawer,
          PlotDataSelection *inPlotDataSelection)

{
  PlotDataBase *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  DummyData *this_01;
  LegendData *this_02;
  size_type sVar3;
  LineDataDrawer *this_03;
  PlotDataSelection *this_04;
  PlotDataSelection *local_68;
  PlotDataSelection *thePlotDataSelection;
  DataDrawerBase *theDataDrawer;
  LegendData *theLegendData;
  DummyData *local_40;
  PlotDataBase *theXData;
  PlotDataSelection *inPlotDataSelection_local;
  DataDrawerBase *inDataDrawer_local;
  LegendData *inLegendData_local;
  PlotDataBase *inYData_local;
  PlotDataBase *inXData_local;
  PlotDataContainer *this_local;
  
  if ((inYData != (PlotDataBase *)0x0) &&
     ((theXData = (PlotDataBase *)inPlotDataSelection,
      inPlotDataSelection_local = (PlotDataSelection *)inDataDrawer,
      inDataDrawer_local = (DataDrawerBase *)inLegendData,
      inLegendData_local = (LegendData *)inYData, inYData_local = inXData,
      inXData_local = (PlotDataBase *)this, iVar1 = (*inYData->_vptr_PlotDataBase[2])(),
      CONCAT44(extraout_var,iVar1) != 0 ||
      (lVar2 = (**(code **)(*(long *)&inLegendData_local->mName + 0x18))(), lVar2 != 0)))) {
    local_40 = (DummyData *)inYData_local;
    if (inYData_local == (PlotDataBase *)0x0) {
      this_01 = (DummyData *)operator_new(0x20);
      lVar2 = PlotDataBase::GetSize((PlotDataBase *)inLegendData_local);
      DummyData::DummyData(this_01,lVar2);
      local_40 = this_01;
    }
    std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::push_back
              (&this->mXDataList,(value_type *)&local_40);
    std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::push_back
              (&this->mYDataList,(value_type *)&inLegendData_local);
    theDataDrawer = inDataDrawer_local;
    if (inDataDrawer_local == (DataDrawerBase *)0x0) {
      this_02 = (LegendData *)operator_new(0xa8);
      LegendData::LegendData(this_02);
      theDataDrawer = (DataDrawerBase *)this_02;
      sVar3 = std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::size
                        (&this->mLegendDataList);
      LegendData::SetDefaultValues(this_02,(int)sVar3);
    }
    std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::push_back
              (&this->mLegendDataList,(value_type *)&theDataDrawer);
    thePlotDataSelection = inPlotDataSelection_local;
    if (inPlotDataSelection_local == (PlotDataSelection *)0x0) {
      this_03 = (LineDataDrawer *)operator_new(0xa8);
      LineDataDrawer::LineDataDrawer(this_03);
      thePlotDataSelection = (PlotDataSelection *)this_03;
    }
    std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>::push_back
              (&this->mDataDrawerList,(value_type *)&thePlotDataSelection);
    this_00 = theXData;
    local_68 = (PlotDataSelection *)theXData;
    if (theXData == (PlotDataBase *)0x0) {
      this_04 = (PlotDataSelection *)operator_new(0x18);
      PlotDataSelection::PlotDataSelection(this_04,0);
      local_68 = this_04;
    }
    else {
      sVar3 = PlotDataBase::GetSize((PlotDataBase *)inLegendData_local);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)this_00,sVar3);
    }
    std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>::
    push_back(&this->mPlotDataSelectionList,&local_68);
  }
  return;
}

Assistant:

void PlotDataContainer::AddXYPlot (PlotDataBase *inXData, PlotDataBase *inYData, LegendData *inLegendData, DataDrawerBase *inDataDrawer, PlotDataSelection *inPlotDataSelection) {
      if (!inYData || (!inYData->GetRealPlotData () && !inYData->GetCalculatedData ())) {
        return;
      }
      PlotDataBase *theXData = inXData;
      if (!theXData) {
        theXData = new DummyData (inYData->GetSize ());
      }
      mXDataList.push_back (theXData);
      mYDataList.push_back (inYData);

      LegendData *theLegendData = inLegendData;
      if (!theLegendData) {
        theLegendData = new LegendData ();
        theLegendData->SetDefaultValues (mLegendDataList.size ());
      }
      mLegendDataList.push_back (theLegendData);

      DataDrawerBase *theDataDrawer = inDataDrawer;
      if (!theDataDrawer) {
        theDataDrawer = new LineDataDrawer ();
      }
      mDataDrawerList.push_back (theDataDrawer);

      PlotDataSelection *thePlotDataSelection = inPlotDataSelection;
      if (!thePlotDataSelection) {
        thePlotDataSelection = new PlotDataSelection ();
      }
      else {
        thePlotDataSelection->resize (inYData->GetSize ());
      }
      mPlotDataSelectionList.push_back (thePlotDataSelection);
    }